

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

qreal differentialForProgress(QEasingCurve *curve,qreal pos)

{
  bool bVar1;
  QDebug *o;
  char *in_RDI;
  long in_FS_OFFSET;
  QMessageLogger *in_XMM0_Qa;
  QMessageLogger *this;
  char *file;
  double dVar2;
  qreal d;
  qreal right;
  qreal left;
  qreal dx;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff60;
  QMessageLogger *this_00;
  QMessageLogger *dbg;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (0.5 <= (double)in_XMM0_Qa) {
    this = in_XMM0_Qa;
    in_XMM0_Qa = (QMessageLogger *)((double)in_XMM0_Qa - 0.01);
  }
  else {
    this = (QMessageLogger *)((double)in_XMM0_Qa + 0.01);
  }
  this_00 = in_XMM0_Qa;
  dbg = this;
  file = (char *)QEasingCurve::valueForProgress((double)this);
  dVar2 = (double)QEasingCurve::valueForProgress((double)in_XMM0_Qa);
  dVar2 = ((double)file - dVar2) / 0.01;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa822f0);
    QMessageLogger::QMessageLogger
              (this,file,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
               (char *)in_stack_ffffffffffffff58,(char *)0xa82306);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)this_00,in_RDI);
    QDebug::QDebug(&local_28,o);
    QEasingCurve::type();
    operator<<((QDebug *)dbg,(Type)((ulong)dVar2 >> 0x20));
    QDebug::operator<<((QDebug *)this_00,in_RDI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
    QDebug::operator<<((QDebug *)this_00,in_RDI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return dVar2;
}

Assistant:

static qreal differentialForProgress(const QEasingCurve &curve, qreal pos)
{
    const qreal dx = 0.01;
    qreal left = (pos < qreal(0.5)) ? pos : pos - qreal(dx);
    qreal right = (pos >= qreal(0.5)) ? pos : pos + qreal(dx);
    qreal d = (curve.valueForProgress(right) - curve.valueForProgress(left)) / qreal(dx);

    qCDebug(lcScroller) << "differentialForProgress(type: " << curve.type()
                        << ", pos: " << pos << ") = " << d;

    return d;
}